

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t helper2(lzma_lzma1_encoder *coder,uint32_t *reps,uint8_t *buf,uint32_t len_end,
                uint32_t position,uint32_t cur,uint32_t nice_len,uint32_t buf_avail_full)

{
  byte bVar1;
  byte bVar2;
  lzma_lzma_state lVar3;
  uint pos_state_00;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  short *psVar19;
  bool bVar20;
  lzma_lzma_state local_204;
  lzma_lzma_state local_200;
  lzma_lzma_state local_1f0;
  lzma_lzma_state local_1d8;
  lzma_lzma_state local_1d4;
  lzma_lzma_state local_1c0;
  lzma_lzma_state local_1b4;
  lzma_lzma_state local_1a4;
  lzma_lzma_state local_1a0;
  uint local_19c;
  uint32_t local_198;
  lzma_lzma_state local_194;
  uint32_t local_17c;
  uint32_t local_178;
  uint32_t local_174;
  uint32_t local_170;
  uint32_t offset_2;
  uint32_t next_rep_match_price_2;
  uint32_t cur_and_len_literal_price_1;
  uint32_t pos_state_next_2;
  lzma_lzma_state state_2_2;
  uint32_t limit_2;
  uint32_t len_test_2_1;
  uint8_t *buf_back_2;
  uint32_t cur_and_len_price_3;
  uint32_t cur_back;
  uint32_t len_test_3;
  uint32_t i_3;
  uint32_t normal_match_price;
  uint32_t cur_and_len_price_2;
  uint32_t offset_1;
  uint32_t next_rep_match_price_1;
  uint32_t cur_and_len_literal_price;
  uint32_t pos_state_next_1;
  lzma_lzma_state state_2_1;
  uint32_t limit_1;
  uint32_t len_test_2;
  uint32_t cur_and_len_price_1;
  uint32_t price;
  uint32_t len_test_temp;
  uint32_t len_test_1;
  uint8_t *buf_back_1;
  lzma_lzma_state local_f0;
  uint32_t rep_index;
  uint32_t start_len;
  uint32_t cur_and_len_price;
  uint32_t offset;
  uint32_t next_rep_match_price;
  uint32_t pos_state_next;
  lzma_lzma_state state_2;
  uint32_t len_test;
  uint32_t limit;
  uint8_t *buf_back;
  uint32_t buf_avail;
  uint32_t short_rep_price;
  uint32_t rep_match_price;
  uint32_t match_price;
  _Bool next_is_literal;
  uint32_t cur_and_1_price;
  uint32_t pos_state;
  uint8_t match_byte;
  uint uStack_a4;
  uint8_t current_byte;
  uint32_t cur_price;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t pos;
  lzma_lzma_state state;
  uint32_t pos_prev;
  uint32_t new_len;
  uint32_t matches_count;
  uint32_t cur_local;
  uint32_t position_local;
  uint32_t len_end_local;
  uint8_t *buf_local;
  uint32_t *reps_local;
  lzma_lzma1_encoder *coder_local;
  uint64_t x_1;
  lzma_lzma_state local_34;
  uint64_t x;
  uint local_c;
  
  pos_prev = coder->matches_count;
  state = coder->longest_match_length;
  pos = coder->opts[cur].pos_prev;
  if ((coder->opts[cur].prev_1_is_literal & 1U) == 0) {
    i = coder->opts[pos].state;
  }
  else {
    pos = pos - 1;
    if ((coder->opts[cur].prev_2 & 1U) == 0) {
      i = coder->opts[pos].state;
    }
    else {
      lVar3 = coder->opts[coder->opts[cur].pos_prev_2].state;
      if (coder->opts[cur].back_prev_2 < 4) {
        i = 0xb;
        if (lVar3 < STATE_LIT_MATCH) {
          i = 8;
        }
      }
      else {
        i = 10;
        if (lVar3 < STATE_LIT_MATCH) {
          i = 7;
        }
      }
    }
    if (i < 4) {
      local_170 = 0;
    }
    else {
      if (i < 10) {
        local_174 = i - 3;
      }
      else {
        local_174 = i - 6;
      }
      local_170 = local_174;
    }
    i = local_170;
  }
  if (pos == cur - 1) {
    if (coder->opts[cur].back_prev == 0) {
      bVar20 = i < 7;
      i = 0xb;
      if (bVar20) {
        i = 9;
      }
    }
    else {
      if (i < 4) {
        local_178 = 0;
      }
      else {
        if (i < 10) {
          local_17c = i - 3;
        }
        else {
          local_17c = i - 6;
        }
        local_178 = local_17c;
      }
      i = local_178;
    }
  }
  else {
    if (((coder->opts[cur].prev_1_is_literal & 1U) == 0) || ((coder->opts[cur].prev_2 & 1U) == 0)) {
      i_1 = coder->opts[cur].back_prev;
      if (i_1 < 4) {
        bVar20 = i < 7;
        i = 0xb;
        if (bVar20) {
          i = 8;
        }
      }
      else {
        bVar20 = i < 7;
        i = 10;
        if (bVar20) {
          i = 7;
        }
      }
    }
    else {
      pos = coder->opts[cur].pos_prev_2;
      i_1 = coder->opts[cur].back_prev_2;
      bVar20 = i < 7;
      i = 0xb;
      if (bVar20) {
        i = 8;
      }
    }
    if (i_1 < 4) {
      *reps = coder->opts[pos].backs[i_1];
      for (i_2 = 1; i_2 <= i_1; i_2 = i_2 + 1) {
        reps[i_2] = coder->opts[pos].backs[i_2 - 1];
      }
      for (; i_2 < 4; i_2 = i_2 + 1) {
        reps[i_2] = coder->opts[pos].backs[i_2];
      }
    }
    else {
      *reps = i_1 - 4;
      for (cur_price = 1; cur_price < 4; cur_price = cur_price + 1) {
        reps[cur_price] = coder->opts[pos].backs[cur_price - 1];
      }
    }
  }
  coder->opts[cur].state = i;
  for (uStack_a4 = 0; uStack_a4 < 4; uStack_a4 = uStack_a4 + 1) {
    coder->opts[cur].backs[uStack_a4] = reps[uStack_a4];
  }
  uVar8 = coder->opts[cur].price;
  bVar1 = *buf;
  bVar2 = buf[-1 - (ulong)*reps];
  pos_state_00 = position & coder->pos_mask;
  uVar4 = rc_bit_0_price(coder->is_match[i][pos_state_00]);
  uVar5 = get_literal_price(coder,position,(uint)buf[-1],(_Bool)((i < 7 ^ 0xffU) & 1),(uint)bVar2,
                            (uint)bVar1);
  uVar6 = uVar8 + uVar4 + uVar5;
  rep_match_price._3_1_ = uVar6 < coder->opts[cur + 1].price;
  if (rep_match_price._3_1_) {
    coder->opts[cur + 1].price = uVar6;
    coder->opts[cur + 1].pos_prev = cur;
    make_literal(coder->opts + (cur + 1));
  }
  uVar4 = rc_bit_1_price(coder->is_match[i][pos_state_00]);
  iVar7 = uVar8 + uVar4;
  uVar8 = rc_bit_1_price(coder->is_rep[i]);
  iVar9 = iVar7 + uVar8;
  if ((bVar2 == bVar1) &&
     ((cur <= coder->opts[cur + 1].pos_prev || (coder->opts[cur + 1].back_prev != 0)))) {
    uVar8 = get_short_rep_price(coder,i,pos_state_00);
    uVar10 = iVar9 + uVar8;
    bVar20 = uVar10 <= coder->opts[cur + 1].price;
    if (bVar20) {
      coder->opts[cur + 1].price = uVar10;
      coder->opts[cur + 1].pos_prev = cur;
      make_short_rep(coder->opts + (cur + 1));
    }
    rep_match_price._3_1_ = bVar20 || rep_match_price._3_1_;
  }
  coder_local._4_4_ = len_end;
  if (1 < buf_avail_full) {
    if (buf_avail_full < nice_len) {
      local_194 = buf_avail_full;
    }
    else {
      local_194 = nice_len;
    }
    cur_local = len_end;
    if ((!rep_match_price._3_1_) && (bVar2 != bVar1)) {
      if (buf_avail_full < nice_len + 1) {
        local_198 = buf_avail_full;
      }
      else {
        local_198 = nice_len + 1;
      }
      x._4_4_ = 1;
      if (local_198 == 0) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if (0x7fffffff < local_198) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
LAB_0070d94d:
      if (x._4_4_ < local_198) {
        uVar18 = *(long *)(buf + x._4_4_) - *(long *)(buf + (ulong)x._4_4_ + (-1 - (ulong)*reps));
        if (uVar18 == 0) goto LAB_0070d9af;
        uVar10 = 0;
        for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
          uVar10 = uVar10 + 1;
        }
        local_19c = (uVar10 >> 3) + x._4_4_;
        if (local_198 <= local_19c) {
          local_19c = local_198;
        }
        local_c = local_19c;
      }
      else {
        local_c = local_198;
      }
      local_c = local_c - 1;
      if (1 < local_c) {
        if (i < 4) {
          local_1a0 = STATE_LIT_LIT;
        }
        else {
          if (i < 10) {
            local_1a4 = i - STATE_SHORTREP_LIT_LIT;
          }
          else {
            local_1a4 = i - STATE_SHORTREP_LIT;
          }
          local_1a0 = local_1a4;
        }
        uVar10 = position + 1 & coder->pos_mask;
        uVar8 = rc_bit_1_price(coder->is_match[local_1a0][uVar10]);
        uVar4 = rc_bit_1_price(coder->is_rep[local_1a0]);
        uVar11 = cur + 1 + local_c;
        while (cur_local < uVar11) {
          cur_local = cur_local + 1;
          coder->opts[cur_local].price = 0x40000000;
        }
        uVar5 = get_rep_price(coder,0,local_c,local_1a0,uVar10);
        uVar6 = uVar6 + uVar8 + uVar4 + uVar5;
        if (uVar6 < coder->opts[uVar11].price) {
          coder->opts[uVar11].price = uVar6;
          coder->opts[uVar11].pos_prev = cur + 1;
          coder->opts[uVar11].back_prev = 0;
          coder->opts[uVar11].prev_1_is_literal = true;
          coder->opts[uVar11].prev_2 = false;
        }
      }
    }
    local_f0 = STATE_REP_LIT_LIT;
    for (buf_back_1._4_4_ = 0; buf_back_1._4_4_ < 4; buf_back_1._4_4_ = buf_back_1._4_4_ + 1) {
      psVar19 = (short *)(buf + (-1 - (ulong)reps[buf_back_1._4_4_]));
      if (*(short *)buf == *psVar19) {
        x_1._4_4_ = STATE_REP_LIT_LIT;
        if (local_194 < STATE_REP_LIT_LIT) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if (0x7fffffff < local_194) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
LAB_0070dcca:
        if (x_1._4_4_ < local_194) {
          uVar18 = *(long *)(buf + x_1._4_4_) - *(long *)((long)psVar19 + (ulong)x_1._4_4_);
          if (uVar18 == 0) goto LAB_0070dd2c;
          uVar6 = 0;
          for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            uVar6 = uVar6 + 1;
          }
          local_1b4 = (uVar6 >> 3) + x_1._4_4_;
          if (local_194 <= local_1b4) {
            local_1b4 = local_194;
          }
          local_34 = local_1b4;
        }
        else {
          local_34 = local_194;
        }
        price = local_34;
        while (cur_local < cur + local_34) {
          cur_local = cur_local + 1;
          coder->opts[cur_local].price = 0x40000000;
        }
        uVar8 = get_pure_rep_price(coder,buf_back_1._4_4_,i,pos_state_00);
        iVar12 = iVar9 + uVar8;
        do {
          uVar8 = get_len_price(&coder->rep_len_encoder,price,pos_state_00);
          uVar6 = iVar12 + uVar8;
          if (uVar6 < coder->opts[cur + price].price) {
            coder->opts[cur + price].price = uVar6;
            coder->opts[cur + price].pos_prev = cur;
            coder->opts[cur + price].back_prev = buf_back_1._4_4_;
            coder->opts[cur + price].prev_1_is_literal = false;
          }
          price = price - 1;
        } while (1 < price);
        if (buf_back_1._4_4_ == 0) {
          local_f0 = local_34 + STATE_MATCH_LIT_LIT;
        }
        state_2_1 = local_34 + STATE_MATCH_LIT_LIT;
        if (buf_avail_full < state_2_1 + nice_len) {
          local_1c0 = buf_avail_full;
        }
        else {
          local_1c0 = state_2_1 + nice_len;
        }
        while( true ) {
          bVar20 = false;
          if (state_2_1 < local_1c0) {
            bVar20 = buf[state_2_1] == *(uint8_t *)((long)psVar19 + (ulong)state_2_1);
          }
          if (!bVar20) break;
          state_2_1 = state_2_1 + STATE_MATCH_LIT_LIT;
        }
        uVar6 = state_2_1 - (local_34 + STATE_MATCH_LIT_LIT);
        if (1 < uVar6) {
          uVar10 = 0xb;
          if (i < 7) {
            uVar10 = 8;
          }
          uVar11 = coder->pos_mask;
          uVar8 = get_len_price(&coder->rep_len_encoder,local_34,pos_state_00);
          uVar4 = rc_bit_0_price(coder->is_match[uVar10][position + local_34 & uVar11]);
          uVar5 = get_literal_price(coder,position + local_34,
                                    (uint)buf[local_34 - STATE_MATCH_LIT_LIT],true,
                                    (uint)*(byte *)((long)psVar19 + (ulong)local_34),
                                    (uint)buf[local_34]);
          if (uVar10 < 4) {
            local_1d4 = STATE_LIT_LIT;
          }
          else {
            if (uVar10 < 10) {
              local_1d8 = uVar10 - STATE_SHORTREP_LIT_LIT;
            }
            else {
              local_1d8 = uVar10 - STATE_SHORTREP_LIT;
            }
            local_1d4 = local_1d8;
          }
          uVar10 = position + local_34 + 1 & coder->pos_mask;
          uVar13 = rc_bit_1_price(coder->is_match[local_1d4][uVar10]);
          uVar14 = rc_bit_1_price(coder->is_rep[local_1d4]);
          uVar11 = cur + local_34 + 1 + uVar6;
          while (cur_local < uVar11) {
            cur_local = cur_local + 1;
            coder->opts[cur_local].price = 0x40000000;
          }
          uVar15 = get_rep_price(coder,0,uVar6,local_1d4,uVar10);
          uVar6 = iVar12 + uVar8 + uVar4 + uVar5 + uVar13 + uVar14 + uVar15;
          if (uVar6 < coder->opts[uVar11].price) {
            coder->opts[uVar11].price = uVar6;
            coder->opts[uVar11].pos_prev = cur + local_34 + 1;
            coder->opts[uVar11].back_prev = 0;
            coder->opts[uVar11].prev_1_is_literal = true;
            coder->opts[uVar11].prev_2 = true;
            coder->opts[uVar11].pos_prev_2 = cur;
            coder->opts[uVar11].back_prev_2 = buf_back_1._4_4_;
          }
        }
      }
    }
    if (local_194 < state) {
      state = local_194;
      pos_prev = 0;
      while (coder->matches[pos_prev].len < local_194) {
        pos_prev = pos_prev + 1;
      }
      coder->matches[pos_prev].len = local_194;
      pos_prev = pos_prev + 1;
    }
    if (local_f0 <= state) {
      uVar8 = rc_bit_0_price(coder->is_rep[i]);
      while (cur_local < cur + state) {
        cur_local = cur_local + 1;
        coder->opts[cur_local].price = 0x40000000;
      }
      cur_back = 0;
      while (coder->matches[cur_back].len < local_f0) {
        cur_back = cur_back + 1;
      }
      cur_and_len_price_3 = local_f0;
      do {
        uVar6 = coder->matches[cur_back].dist;
        uVar4 = get_dist_len_price(coder,uVar6,cur_and_len_price_3,pos_state_00);
        uVar10 = iVar7 + uVar8 + uVar4;
        if (uVar10 < coder->opts[cur + cur_and_len_price_3].price) {
          coder->opts[cur + cur_and_len_price_3].price = uVar10;
          coder->opts[cur + cur_and_len_price_3].pos_prev = cur;
          coder->opts[cur + cur_and_len_price_3].back_prev = uVar6 + 4;
          coder->opts[cur + cur_and_len_price_3].prev_1_is_literal = false;
        }
        if (cur_and_len_price_3 == coder->matches[cur_back].len) {
          state_2_2 = cur_and_len_price_3 + STATE_MATCH_LIT_LIT;
          if (buf_avail_full < state_2_2 + nice_len) {
            local_1f0 = buf_avail_full;
          }
          else {
            local_1f0 = state_2_2 + nice_len;
          }
          while( true ) {
            bVar20 = false;
            if (state_2_2 < local_1f0) {
              bVar20 = buf[state_2_2] == buf[(ulong)state_2_2 + (-1 - (ulong)uVar6)];
            }
            if (!bVar20) break;
            state_2_2 = state_2_2 + STATE_MATCH_LIT_LIT;
          }
          uVar11 = state_2_2 - (cur_and_len_price_3 + 1);
          if (1 < uVar11) {
            uVar17 = 10;
            if (i < 7) {
              uVar17 = 7;
            }
            uVar16 = position + cur_and_len_price_3 & coder->pos_mask;
            uVar4 = rc_bit_0_price(coder->is_match[uVar17][uVar16]);
            uVar5 = get_literal_price(coder,position + cur_and_len_price_3,
                                      (uint)buf[cur_and_len_price_3 - 1],true,
                                      (uint)buf[(ulong)cur_and_len_price_3 + (-1 - (ulong)uVar6)],
                                      (uint)buf[cur_and_len_price_3]);
            if (uVar17 < 4) {
              local_200 = STATE_LIT_LIT;
            }
            else {
              if (uVar17 < 10) {
                local_204 = uVar17 - STATE_SHORTREP_LIT_LIT;
              }
              else {
                local_204 = uVar17 - STATE_SHORTREP_LIT;
              }
              local_200 = local_204;
            }
            uVar17 = uVar16 + 1 & coder->pos_mask;
            uVar13 = rc_bit_1_price(coder->is_match[local_200][uVar17]);
            uVar14 = rc_bit_1_price(coder->is_rep[local_200]);
            uVar16 = cur + cur_and_len_price_3 + 1 + uVar11;
            while (cur_local < uVar16) {
              cur_local = cur_local + 1;
              coder->opts[cur_local].price = 0x40000000;
            }
            uVar15 = get_rep_price(coder,0,uVar11,local_200,uVar17);
            uVar10 = uVar10 + uVar4 + uVar5 + uVar13 + uVar14 + uVar15;
            if (uVar10 < coder->opts[uVar16].price) {
              coder->opts[uVar16].price = uVar10;
              coder->opts[uVar16].pos_prev = cur + cur_and_len_price_3 + 1;
              coder->opts[uVar16].back_prev = 0;
              coder->opts[uVar16].prev_1_is_literal = true;
              coder->opts[uVar16].prev_2 = true;
              coder->opts[uVar16].pos_prev_2 = cur;
              coder->opts[uVar16].back_prev_2 = uVar6 + 4;
            }
          }
          cur_back = cur_back + 1;
          if (cur_back == pos_prev) break;
        }
        cur_and_len_price_3 = cur_and_len_price_3 + 1;
      } while( true );
    }
    coder_local._4_4_ = cur_local;
  }
  return coder_local._4_4_;
LAB_0070d9af:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_0070d94d;
LAB_0070dd2c:
  x_1._4_4_ = x_1._4_4_ + STATE_LIT_LONGREP;
  goto LAB_0070dcca;
}

Assistant:

static inline uint32_t
helper2(lzma_lzma1_encoder *coder, uint32_t *reps, const uint8_t *buf,
		uint32_t len_end, uint32_t position, const uint32_t cur,
		const uint32_t nice_len, const uint32_t buf_avail_full)
{
	uint32_t matches_count = coder->matches_count;
	uint32_t new_len = coder->longest_match_length;
	uint32_t pos_prev = coder->opts[cur].pos_prev;
	lzma_lzma_state state;

	if (coder->opts[cur].prev_1_is_literal) {
		--pos_prev;

		if (coder->opts[cur].prev_2) {
			state = coder->opts[coder->opts[cur].pos_prev_2].state;

			if (coder->opts[cur].back_prev_2 < REPS)
				update_long_rep(state);
			else
				update_match(state);

		} else {
			state = coder->opts[pos_prev].state;
		}

		update_literal(state);

	} else {
		state = coder->opts[pos_prev].state;
	}

	if (pos_prev == cur - 1) {
		if (is_short_rep(coder->opts[cur]))
			update_short_rep(state);
		else
			update_literal(state);
	} else {
		uint32_t pos;
		if (coder->opts[cur].prev_1_is_literal
				&& coder->opts[cur].prev_2) {
			pos_prev = coder->opts[cur].pos_prev_2;
			pos = coder->opts[cur].back_prev_2;
			update_long_rep(state);
		} else {
			pos = coder->opts[cur].back_prev;
			if (pos < REPS)
				update_long_rep(state);
			else
				update_match(state);
		}

		if (pos < REPS) {
			reps[0] = coder->opts[pos_prev].backs[pos];

			uint32_t i;
			for (i = 1; i <= pos; ++i)
				reps[i] = coder->opts[pos_prev].backs[i - 1];

			for (; i < REPS; ++i)
				reps[i] = coder->opts[pos_prev].backs[i];

		} else {
			reps[0] = pos - REPS;

			for (uint32_t i = 1; i < REPS; ++i)
				reps[i] = coder->opts[pos_prev].backs[i - 1];
		}
	}

	coder->opts[cur].state = state;

	for (uint32_t i = 0; i < REPS; ++i)
		coder->opts[cur].backs[i] = reps[i];

	const uint32_t cur_price = coder->opts[cur].price;

	const uint8_t current_byte = *buf;
	const uint8_t match_byte = *(buf - reps[0] - 1);

	const uint32_t pos_state = position & coder->pos_mask;

	const uint32_t cur_and_1_price = cur_price
			+ rc_bit_0_price(coder->is_match[state][pos_state])
			+ get_literal_price(coder, position, buf[-1],
			!is_literal_state(state), match_byte, current_byte);

	bool next_is_literal = false;

	if (cur_and_1_price < coder->opts[cur + 1].price) {
		coder->opts[cur + 1].price = cur_and_1_price;
		coder->opts[cur + 1].pos_prev = cur;
		make_literal(&coder->opts[cur + 1]);
		next_is_literal = true;
	}

	const uint32_t match_price = cur_price
			+ rc_bit_1_price(coder->is_match[state][pos_state]);
	const uint32_t rep_match_price = match_price
			+ rc_bit_1_price(coder->is_rep[state]);

	if (match_byte == current_byte
			&& !(coder->opts[cur + 1].pos_prev < cur
				&& coder->opts[cur + 1].back_prev == 0)) {

		const uint32_t short_rep_price = rep_match_price
				+ get_short_rep_price(coder, state, pos_state);

		if (short_rep_price <= coder->opts[cur + 1].price) {
			coder->opts[cur + 1].price = short_rep_price;
			coder->opts[cur + 1].pos_prev = cur;
			make_short_rep(&coder->opts[cur + 1]);
			next_is_literal = true;
		}
	}

	if (buf_avail_full < 2)
		return len_end;

	const uint32_t buf_avail = my_min(buf_avail_full, nice_len);

	if (!next_is_literal && match_byte != current_byte) { // speed optimization
		// try literal + rep0
		const uint8_t *const buf_back = buf - reps[0] - 1;
		const uint32_t limit = my_min(buf_avail_full, nice_len + 1);

		const uint32_t len_test = lzma_memcmplen(buf, buf_back, 1, limit) - 1;

		if (len_test >= 2) {
			lzma_lzma_state state_2 = state;
			update_literal(state_2);

			const uint32_t pos_state_next = (position + 1) & coder->pos_mask;
			const uint32_t next_rep_match_price = cur_and_1_price
					+ rc_bit_1_price(coder->is_match[state_2][pos_state_next])
					+ rc_bit_1_price(coder->is_rep[state_2]);

			//for (; len_test >= 2; --len_test) {
			const uint32_t offset = cur + 1 + len_test;

			while (len_end < offset)
				coder->opts[++len_end].price = RC_INFINITY_PRICE;

			const uint32_t cur_and_len_price = next_rep_match_price
					+ get_rep_price(coder, 0, len_test,
						state_2, pos_state_next);

			if (cur_and_len_price < coder->opts[offset].price) {
				coder->opts[offset].price = cur_and_len_price;
				coder->opts[offset].pos_prev = cur + 1;
				coder->opts[offset].back_prev = 0;
				coder->opts[offset].prev_1_is_literal = true;
				coder->opts[offset].prev_2 = false;
			}
			//}
		}
	}


	uint32_t start_len = 2; // speed optimization

	for (uint32_t rep_index = 0; rep_index < REPS; ++rep_index) {
		const uint8_t *const buf_back = buf - reps[rep_index] - 1;
		if (not_equal_16(buf, buf_back))
			continue;

		uint32_t len_test = lzma_memcmplen(buf, buf_back, 2, buf_avail);

		while (len_end < cur + len_test)
			coder->opts[++len_end].price = RC_INFINITY_PRICE;

		const uint32_t len_test_temp = len_test;
		const uint32_t price = rep_match_price + get_pure_rep_price(
				coder, rep_index, state, pos_state);

		do {
			const uint32_t cur_and_len_price = price
					+ get_len_price(&coder->rep_len_encoder,
							len_test, pos_state);

			if (cur_and_len_price < coder->opts[cur + len_test].price) {
				coder->opts[cur + len_test].price = cur_and_len_price;
				coder->opts[cur + len_test].pos_prev = cur;
				coder->opts[cur + len_test].back_prev = rep_index;
				coder->opts[cur + len_test].prev_1_is_literal = false;
			}
		} while (--len_test >= 2);

		len_test = len_test_temp;

		if (rep_index == 0)
			start_len = len_test + 1;


		uint32_t len_test_2 = len_test + 1;
		const uint32_t limit = my_min(buf_avail_full,
				len_test_2 + nice_len);
		for (; len_test_2 < limit
				&& buf[len_test_2] == buf_back[len_test_2];
				++len_test_2) ;

		len_test_2 -= len_test + 1;

		if (len_test_2 >= 2) {
			lzma_lzma_state state_2 = state;
			update_long_rep(state_2);

			uint32_t pos_state_next = (position + len_test) & coder->pos_mask;

			const uint32_t cur_and_len_literal_price = price
					+ get_len_price(&coder->rep_len_encoder,
						len_test, pos_state)
					+ rc_bit_0_price(coder->is_match[state_2][pos_state_next])
					+ get_literal_price(coder, position + len_test,
						buf[len_test - 1], true,
						buf_back[len_test], buf[len_test]);

			update_literal(state_2);

			pos_state_next = (position + len_test + 1) & coder->pos_mask;

			const uint32_t next_rep_match_price = cur_and_len_literal_price
					+ rc_bit_1_price(coder->is_match[state_2][pos_state_next])
					+ rc_bit_1_price(coder->is_rep[state_2]);

			//for(; len_test_2 >= 2; len_test_2--) {
			const uint32_t offset = cur + len_test + 1 + len_test_2;

			while (len_end < offset)
				coder->opts[++len_end].price = RC_INFINITY_PRICE;

			const uint32_t cur_and_len_price = next_rep_match_price
					+ get_rep_price(coder, 0, len_test_2,
						state_2, pos_state_next);

			if (cur_and_len_price < coder->opts[offset].price) {
				coder->opts[offset].price = cur_and_len_price;
				coder->opts[offset].pos_prev = cur + len_test + 1;
				coder->opts[offset].back_prev = 0;
				coder->opts[offset].prev_1_is_literal = true;
				coder->opts[offset].prev_2 = true;
				coder->opts[offset].pos_prev_2 = cur;
				coder->opts[offset].back_prev_2 = rep_index;
			}
			//}
		}
	}


	//for (uint32_t len_test = 2; len_test <= new_len; ++len_test)
	if (new_len > buf_avail) {
		new_len = buf_avail;

		matches_count = 0;
		while (new_len > coder->matches[matches_count].len)
			++matches_count;

		coder->matches[matches_count++].len = new_len;
	}


	if (new_len >= start_len) {
		const uint32_t normal_match_price = match_price
				+ rc_bit_0_price(coder->is_rep[state]);

		while (len_end < cur + new_len)
			coder->opts[++len_end].price = RC_INFINITY_PRICE;

		uint32_t i = 0;
		while (start_len > coder->matches[i].len)
			++i;

		for (uint32_t len_test = start_len; ; ++len_test) {
			const uint32_t cur_back = coder->matches[i].dist;
			uint32_t cur_and_len_price = normal_match_price
					+ get_dist_len_price(coder,
						cur_back, len_test, pos_state);

			if (cur_and_len_price < coder->opts[cur + len_test].price) {
				coder->opts[cur + len_test].price = cur_and_len_price;
				coder->opts[cur + len_test].pos_prev = cur;
				coder->opts[cur + len_test].back_prev
						= cur_back + REPS;
				coder->opts[cur + len_test].prev_1_is_literal = false;
			}

			if (len_test == coder->matches[i].len) {
				// Try Match + Literal + Rep0
				const uint8_t *const buf_back = buf - cur_back - 1;
				uint32_t len_test_2 = len_test + 1;
				const uint32_t limit = my_min(buf_avail_full,
						len_test_2 + nice_len);

				for (; len_test_2 < limit &&
						buf[len_test_2] == buf_back[len_test_2];
						++len_test_2) ;

				len_test_2 -= len_test + 1;

				if (len_test_2 >= 2) {
					lzma_lzma_state state_2 = state;
					update_match(state_2);
					uint32_t pos_state_next
							= (position + len_test) & coder->pos_mask;

					const uint32_t cur_and_len_literal_price = cur_and_len_price
							+ rc_bit_0_price(
								coder->is_match[state_2][pos_state_next])
							+ get_literal_price(coder,
								position + len_test,
								buf[len_test - 1],
								true,
								buf_back[len_test],
								buf[len_test]);

					update_literal(state_2);
					pos_state_next = (pos_state_next + 1) & coder->pos_mask;

					const uint32_t next_rep_match_price
							= cur_and_len_literal_price
							+ rc_bit_1_price(
								coder->is_match[state_2][pos_state_next])
							+ rc_bit_1_price(coder->is_rep[state_2]);

					// for(; len_test_2 >= 2; --len_test_2) {
					const uint32_t offset = cur + len_test + 1 + len_test_2;

					while (len_end < offset)
						coder->opts[++len_end].price = RC_INFINITY_PRICE;

					cur_and_len_price = next_rep_match_price
							+ get_rep_price(coder, 0, len_test_2,
								state_2, pos_state_next);

					if (cur_and_len_price < coder->opts[offset].price) {
						coder->opts[offset].price = cur_and_len_price;
						coder->opts[offset].pos_prev = cur + len_test + 1;
						coder->opts[offset].back_prev = 0;
						coder->opts[offset].prev_1_is_literal = true;
						coder->opts[offset].prev_2 = true;
						coder->opts[offset].pos_prev_2 = cur;
						coder->opts[offset].back_prev_2
								= cur_back + REPS;
					}
					//}
				}

				if (++i == matches_count)
					break;
			}
		}
	}

	return len_end;
}